

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::ReadBasicType(AsciiParser *this,color4h *value)

{
  bool bVar1;
  half hVar2;
  reference pvVar3;
  undefined1 local_30 [8];
  float4 v;
  color4h *value_local;
  AsciiParser *this_local;
  
  v._M_elems._8_8_ = value;
  bVar1 = ParseBasicTypeTuple<float,4ul>(this,(array<float,_4UL> *)local_30);
  if (bVar1) {
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,0);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)v._M_elems._8_8_ = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,1);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)(v._M_elems._8_8_ + 2) = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,2);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)(v._M_elems._8_8_ + 4) = hVar2.value;
    pvVar3 = ::std::array<float,_4UL>::operator[]((array<float,_4UL> *)local_30,3);
    hVar2 = tinyusdz::value::float_to_half_full(*pvVar3);
    *(uint16_t *)(v._M_elems._8_8_ + 6) = hVar2.value;
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(value::color4h *value) {
  // parse as float4
  value::float4 v;
  if (ParseBasicTypeTuple(&v)) {
    value->r = value::float_to_half_full(v[0]);
    value->g = value::float_to_half_full(v[1]);
    value->b = value::float_to_half_full(v[2]);
    value->a = value::float_to_half_full(v[3]);
    return true;
  }
  return false;
}